

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::end_scope_decl(CompilerGLSL *this,string *decl)

{
  CompilerError *this_00;
  allocator local_39;
  string local_38;
  
  if (this->indent != 0) {
    this->indent = this->indent - 1;
    statement<char_const(&)[3],std::__cxx11::string_const&,char_const(&)[2]>
              (this,(char (*) [3])"} ",decl,(char (*) [2])0x304bae);
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Popping empty indent stack.",&local_39);
  CompilerError::CompilerError(this_00,&local_38);
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::end_scope_decl(const string &decl)
{
	if (!indent)
		SPIRV_CROSS_THROW("Popping empty indent stack.");
	indent--;
	statement("} ", decl, ";");
}